

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<VkSpecParser::Command>::remove(QList<VkSpecParser::Command> *this,char *__filename)

{
  QList<VkSpecParser::Command> *extraout_RAX;
  long in_RDX;
  qsizetype unaff_retaddr;
  Command *in_stack_00000008;
  QGenericArrayOps<VkSpecParser::Command> *in_stack_00000010;
  QArrayDataPointer<VkSpecParser::Command> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<VkSpecParser::Command>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<VkSpecParser::Command>::operator->(&this->d);
    QArrayDataPointer<VkSpecParser::Command>::operator->(&this->d);
    QArrayDataPointer<VkSpecParser::Command>::begin
              ((QArrayDataPointer<VkSpecParser::Command> *)0x10a179);
    QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}